

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

string * __thiscall
deqp::gls::BuiltinPrecisionTests::
GenFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Signature<float,float,float,float,deqp::gls::BuiltinPrecisionTests::Void>>
::getDesc_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  void *local_18;
  GenFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *this_local;
  
  local_18 = this;
  this_local = (GenFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
                *)__return_storage_ptr__;
  (**(code **)(**(long **)((long)this + 8) + 0x10))();
  std::operator+(&local_38,"Function \'",&local_58);
  std::operator+(__return_storage_ptr__,&local_38,"\'");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

string				getDesc				(void) const
	{
		return "Function '" + m_funcs.func.getName() + "'";
	}